

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkTargetIDList.cpp
# Opt level: O0

void __thiscall LinkTargetIDList::printLinkTargetIdListInHexStyle(LinkTargetIDList *this)

{
  ostream *poVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  int local_38;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  LinkTargetIDList *local_10;
  LinkTargetIDList *this_local;
  
  local_10 = this;
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "_________________LinkTargetIdList in Hex Style___________________");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"IDListSize:                         ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_28,&this->IDListSize);
  Utils::print_vec(&local_28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,"IDList:                             ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_38 = 0;
  while( true ) {
    uVar2 = (ulong)local_38;
    sVar3 = std::vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
            ::size(&this->IDList);
    if (sVar3 <= uVar2) break;
    poVar1 = std::operator<<((ostream *)&std::cout,"   ItemID ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_38 + 1);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"       ItemIDSize:                  ");
    pvVar4 = std::
             vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>::
             operator[](&this->IDList,(long)local_38);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,&pvVar4->ItemIDSize);
    Utils::print_vec(&local_50);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_50);
    std::operator<<((ostream *)&std::cout,"       Data:                        ");
    pvVar4 = std::
             vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>::
             operator[](&this->IDList,(long)local_38);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_68,&pvVar4->Data);
    Utils::print_vec(&local_68);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_68);
    local_38 = local_38 + 1;
  }
  std::operator<<((ostream *)&std::cout,"   TerminalID:                      ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,&this->TerminalID);
  Utils::print_vec(&local_80);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_80);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "_________________________________________________________");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void LinkTargetIDList::printLinkTargetIdListInHexStyle() {
    cout <<"_________________LinkTargetIdList in Hex Style___________________" << endl;
    cout << "IDListSize:                         " ; Utils::print_vec(IDListSize);
    cout << "IDList:                             " << endl ;
    for(int i = 0; i < IDList.size(); ++i){
        cout << "   ItemID " << dec << i + 1 << endl;
        cout << "       ItemIDSize:                  "; Utils::print_vec(IDList[i].ItemIDSize);
        cout << "       Data:                        "; Utils::print_vec(IDList[i].Data);
    }
    cout << "   TerminalID:                      "; Utils::print_vec(TerminalID);
    cout << "_________________________________________________________" << endl;
}